

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_p.h
# Opt level: O0

int __thiscall
QSharedDataPointer<QLocalePrivate>::clone
          (QSharedDataPointer<QLocalePrivate> *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  long lVar1;
  QLocalePrivate *index;
  QLocalePrivate *pQVar2;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffbc;
  QLocalePrivate *this_00;
  QFlagsStorage<QLocale::NumberOption> numberOptions;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  index = (QLocalePrivate *)operator_new(0x20);
  this_00 = index;
  pQVar2 = Qt::totally_ordered_wrapper<QLocalePrivate_*>::operator->
                     ((totally_ordered_wrapper<QLocalePrivate_*> *)0x8cc693);
  numberOptions.i = (Int)((ulong)pQVar2->m_data >> 0x20);
  Qt::totally_ordered_wrapper<QLocalePrivate_*>::operator->
            ((totally_ordered_wrapper<QLocalePrivate_*> *)0x8cc6a5);
  Qt::totally_ordered_wrapper<QLocalePrivate_*>::operator->
            ((totally_ordered_wrapper<QLocalePrivate_*> *)0x8cc6b8);
  QLocalePrivate::QLocalePrivate
            (this_00,(QLocaleData *)this,(qsizetype)index,(NumberOptions)numberOptions.i,
             in_stack_ffffffffffffffbc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)index;
  }
  __stack_chk_fail();
}

Assistant:

inline QLocalePrivate *QSharedDataPointer<QLocalePrivate>::clone()
{
    // cannot use QLocalePrivate's copy constructor
    // since it is deleted in C++11
    return new QLocalePrivate(d->m_data, d->m_index, d->m_numberOptions);
}